

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int __thiscall CVmUTF8Source::readc(CVmUTF8Source *this,void *buf0,size_t len)

{
  wchar_t wVar1;
  char *pcVar2;
  ulong in_RDX;
  undefined1 *in_RSI;
  char *in_RDI;
  wchar_t ch;
  size_t i;
  utf8_ptr p;
  size_t rem;
  char *buf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ulong local_38;
  utf8_ptr local_30;
  ulong local_28;
  undefined1 *local_20;
  ulong local_18;
  
  local_28 = *(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x28);
  local_18 = in_RDX;
  if (local_28 < in_RDX) {
    local_18 = local_28;
  }
  local_20 = in_RSI;
  utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_RDI);
  local_38 = 0;
  while( true ) {
    if (local_18 <= local_38) {
      pcVar2 = utf8_ptr::getptr(&local_30);
      *(long *)(in_RDI + 0x20) = (long)pcVar2 - *(long *)(in_RDI + 8);
      return (int)local_18;
    }
    wVar1 = utf8_ptr::getch((utf8_ptr *)0x34415e);
    if (L'ÿ' < wVar1) break;
    *local_20 = (char)wVar1;
    local_38 = local_38 + 1;
    local_20 = local_20 + 1;
    utf8_ptr::inc((utf8_ptr *)CONCAT44(wVar1,in_stack_ffffffffffffffc0));
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
  }
  err_throw(0);
}

Assistant:

virtual int readc(void *buf0, size_t len)
    {
        /* get the output buffer pointer as a character pointer */
        char *buf = (char *)buf0;
        
        /* 
         *   limit the length to the remaining number of characters from the
         *   current position 
         */
        size_t rem = charlen - charidx;
        if (len > rem)
            len = rem;

        /* do the copy */
        utf8_ptr p((char *)str + byteidx);
        for (size_t i = 0 ; i < len ; ++i, p.inc(), ++charidx)
        {
            /* get this character */
            wchar_t ch = p.getch();

            /* if it's outside of the 0..255 range, it's an error */
            if (ch > 255)
                err_throw(VMERR_NUM_OVERFLOW);

            /* store it */
            *buf++ = (char)ch;
        }

        /* calculate the new byte index */
        byteidx = (size_t)(p.getptr() - str);

        /* return the length we copied */
        return len;
    }